

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightLeSample * __thiscall
pbrt::ProjectionLight::SampleLe
          (ProjectionLight *this,Point2f *u1,Point2f *u2,SampledWavelengths *lambda,Float time)

{
  Point2f p_00;
  char (*args) [9];
  char (*args_2) [9];
  array<pbrt::WrapMode,_2> wrapMode;
  Float *pFVar1;
  long in_RSI;
  LightLeSample *in_RDI;
  RGBSpectrum *this_00;
  LogLevel in_XMM0_Da;
  float fVar2;
  float fVar3;
  undefined1 extraout_var [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  Point3<float> PVar15;
  Vector3<float> VVar16;
  SampledSpectrum SVar17;
  SampledSpectrum L;
  int c;
  RGB rgb;
  Point2f p;
  Float pdfDir;
  int vb;
  Float va;
  Float cosTheta;
  Ray ray;
  Vector3f w;
  Point2f ps;
  Float pdf;
  SampledSpectrum *in_stack_fffffffffffffda8;
  LightLeSample *in_stack_fffffffffffffdb0;
  Bounds2<float> *in_stack_fffffffffffffdb8;
  LightLeSample *in_stack_fffffffffffffdc0;
  Point3f *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  Float *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  Float in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  float fVar18;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  char *fmt;
  undefined4 in_stack_fffffffffffffe10;
  int line;
  RGBColorSpace *cs;
  undefined4 in_stack_fffffffffffffe20;
  float *args_3;
  char (*args_4) [2];
  LightLeSample *args_5;
  Float *in_stack_fffffffffffffe88;
  Ray *in_stack_fffffffffffffe90;
  Transform *in_stack_fffffffffffffe98;
  float local_144;
  RGB local_140;
  undefined8 local_134;
  float local_124;
  undefined4 local_120;
  Float local_11c;
  Tuple3<pbrt::Vector3,_float> local_118;
  Tuple3<pbrt::Vector3,_float> local_108;
  Float local_fc;
  undefined8 local_f0;
  float local_e8;
  undefined8 local_e0;
  float local_d8;
  float local_c8 [8];
  Point3<float> *in_stack_ffffffffffffff58;
  Transform *in_stack_ffffffffffffff60;
  char local_64 [12];
  Float local_58 [2];
  float local_50;
  char local_4c [12];
  undefined8 local_40;
  float local_38;
  LogLevel local_34;
  undefined1 auVar10 [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar11 [56];
  
  args_5 = in_RDI;
  local_34 = in_XMM0_Da;
  auVar12._0_8_ =
       PiecewiseConstant2D::Sample
                 ((PiecewiseConstant2D *)
                  CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                  (Point2f *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                  in_stack_fffffffffffffdd8);
  auVar12._8_56_ = extraout_var;
  local_40 = vmovlpd_avx(auVar12._0_16_);
  if ((local_38 != 0.0) || (NAN(local_38))) {
    args = (char (*) [9])(in_RSI + 0x250);
    auVar10 = (undefined1  [56])0x0;
    fmt = local_64;
    line = 0;
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffffdb0,
               (float)((ulong)in_stack_fffffffffffffda8 >> 0x20),SUB84(in_stack_fffffffffffffda8,0),
               0.0);
    PVar15 = Transform::operator()(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_50 = PVar15.super_Tuple3<pbrt::Point3,_float>.z;
    auVar4._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar4._8_56_ = auVar10;
    local_58 = (Float  [2])vmovlpd_avx(auVar4._0_16_);
    args_4 = (char (*) [2])local_4c;
    Vector3<float>::Vector3<float>
              ((Vector3<float> *)in_stack_fffffffffffffdb0,
               (Point3<float> *)in_stack_fffffffffffffda8);
    args_2 = (char (*) [9])(in_RSI + 0x18);
    cs = (RGBColorSpace *)&stack0xffffffffffffff2c;
    auVar10 = ZEXT856(0);
    Point3<float>::Point3
              ((Point3<float> *)in_stack_fffffffffffffdb0,
               (float)((ulong)in_stack_fffffffffffffda8 >> 0x20),SUB84(in_stack_fffffffffffffda8,0),
               0.0);
    VVar16 = Normalize<float>((Vector3<float> *)
                              CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    local_e8 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar5._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar10;
    local_f0 = vmovlpd_avx(auVar5._0_16_);
    local_e0 = local_f0;
    local_d8 = local_e8;
    MediumHandle::MediumHandle
              ((MediumHandle *)in_stack_fffffffffffffdb0,(MediumHandle *)in_stack_fffffffffffffda8);
    auVar10 = (undefined1  [56])0x0;
    args_3 = local_c8;
    Ray::Ray((Ray *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             in_stack_fffffffffffffdc8,(Vector3f *)in_stack_fffffffffffffdc0,
             (Float)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
             (MediumHandle *)in_stack_fffffffffffffdb0);
    Transform::operator()
              (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    VVar16 = Normalize<float>((Vector3<float> *)
                              CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    local_118.z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar10;
    local_118._0_8_ = vmovlpd_avx(auVar6._0_16_);
    local_108._0_8_ = local_118._0_8_;
    local_108.z = local_118.z;
    local_11c = CosTheta((Vector3f *)&local_108);
    local_120 = 0;
    local_fc = local_11c;
    if (local_11c <= 0.0) {
      LogFatal<char_const(&)[9],char_const(&)[2],char_const(&)[9],float&,char_const(&)[2],int&>
                (local_34,(char *)cs,line,fmt,args,
                 (char (*) [2])CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),args_2,
                 args_3,args_4,(int *)args_5);
    }
    this_00 = (RGBSpectrum *)(in_RSI + 0x1bc);
    fVar2 = Bounds2<float>::Area((Bounds2<float> *)in_stack_fffffffffffffdb0);
    fVar2 = local_38 * fVar2;
    fVar18 = *(float *)(in_RSI + 0x2d0);
    fVar3 = Pow<3>((float)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
    auVar12 = ZEXT464((uint)(fVar18 * fVar3));
    local_124 = fVar2 / (fVar18 * fVar3);
    auVar7._0_8_ = Bounds2<float>::Offset
                             (in_stack_fffffffffffffdb8,(Point2<float> *)in_stack_fffffffffffffdb0);
    auVar7._8_56_ = extraout_var_00;
    local_134 = vmovlpd_avx(auVar7._0_16_);
    Point2<float>::Point2<float>
              ((Point2<float> *)in_stack_fffffffffffffdb0,
               (Vector2<float> *)in_stack_fffffffffffffda8);
    RGB::RGB(&local_140);
    fVar2 = local_38;
    for (local_144 = 0.0; auVar10 = auVar12._8_56_, (int)local_144 < 3;
        local_144 = (float)((int)local_144 + 1)) {
      wrapMode.values = (WrapMode  [2])(in_RSI + 0x98);
      fVar3 = local_144;
      WrapMode2D::WrapMode2D
                ((WrapMode2D *)in_stack_fffffffffffffdc0,
                 (WrapMode)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
      p_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffde4;
      p_00.super_Tuple2<pbrt::Point2,_float>.x = fVar3;
      in_stack_fffffffffffffde4 =
           Image::LookupNearestChannel
                     ((Image *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),p_00,
                      (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),(WrapMode2D)wrapMode.values);
      pFVar1 = RGB::operator[](&local_140,(int)local_144);
      *pFVar1 = in_stack_fffffffffffffde4;
    }
    auVar11 = (undefined1  [56])0x0;
    RGBSpectrum::RGBSpectrum
              ((RGBSpectrum *)CONCAT44(local_34,in_stack_fffffffffffffe20),cs,
               (RGB *)CONCAT44(line,in_stack_fffffffffffffe10));
    SVar17 = RGBSpectrum::Sample(this_00,(SampledWavelengths *)CONCAT44(fVar18,fVar2));
    auVar13._0_8_ = SVar17.values.values._8_8_;
    auVar13._8_56_ = auVar10;
    auVar8._0_8_ = SVar17.values.values._0_8_;
    auVar8._8_56_ = auVar11;
    auVar11 = (undefined1  [56])0x0;
    vmovlpd_avx(auVar8._0_16_);
    vmovlpd_avx(auVar13._0_16_);
    SVar17 = pbrt::operator*((Float)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                             in_stack_fffffffffffffda8);
    auVar14._0_8_ = SVar17.values.values._8_8_;
    auVar14._8_56_ = auVar10;
    auVar9._0_8_ = SVar17.values.values._0_8_;
    auVar9._8_56_ = auVar11;
    vmovlpd_avx(auVar9._0_16_);
    vmovlpd_avx(auVar14._0_16_);
    LightLeSample::LightLeSample
              (in_stack_fffffffffffffdc0,(SampledSpectrum *)in_stack_fffffffffffffdb8,
               (Ray *)in_stack_fffffffffffffdb0,(Float)((ulong)in_stack_fffffffffffffda8 >> 0x20),
               SUB84(in_stack_fffffffffffffda8,0));
  }
  else {
    memset(args_5,0,0x98);
    LightLeSample::LightLeSample(in_stack_fffffffffffffdb0);
  }
  return in_RDI;
}

Assistant:

LightLeSample ProjectionLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                        SampledWavelengths &lambda, Float time) const {
    Float pdf;
    Point2f ps = distrib.Sample(u1, &pdf);
    if (pdf == 0)
        return {};

    Vector3f w = Vector3f(LightFromScreen(Point3f(ps.x, ps.y, 0)));

    Ray ray = renderFromLight(
        Ray(Point3f(0, 0, 0), Normalize(w), time, mediumInterface.outside));
    Float cosTheta = CosTheta(Normalize(w));
    CHECK_GT(cosTheta, 0);
    Float pdfDir = pdf * screenBounds.Area() / (A * Pow<3>(cosTheta));

    Point2f p = Point2f(screenBounds.Offset(ps));
    RGB rgb;
    for (int c = 0; c < 3; ++c)
        rgb[c] = image.LookupNearestChannel(p, c);

    SampledSpectrum L = scale * RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);

    return LightLeSample(L, ray, 1, pdfDir);
}